

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiexsas.c
# Opt level: O3

HTTPAPIEX_SAS_STATE * construct_httpex_sas(char *key,char *uriResource,char *keyName)

{
  int iVar1;
  HTTPAPIEX_SAS_HANDLE handle;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  
  handle = (HTTPAPIEX_SAS_HANDLE)calloc(1,0x18);
  if (handle == (HTTPAPIEX_SAS_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (HTTPAPIEX_SAS_STATE *)0x0;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiexsas.c"
              ,"construct_httpex_sas",0x21,1,"Failure allocating HTTPAPIEX_SAS_Create.");
    return (HTTPAPIEX_SAS_STATE *)0x0;
  }
  iVar1 = mallocAndStrcpy_s((char **)handle,key);
  if (iVar1 == 0) {
    iVar1 = mallocAndStrcpy_s(&handle->uriResource,uriResource);
    if (iVar1 == 0) {
      if (keyName == (char *)0x0) {
        return handle;
      }
      iVar1 = mallocAndStrcpy_s(&handle->keyName,keyName);
      if (iVar1 == 0) {
        return handle;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0017ffd8;
      pcVar3 = "Failure allocating sas keyName.";
      iVar1 = 0x37;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0017ffd8;
      pcVar3 = "Failure allocating sas uriResource.";
      iVar1 = 0x30;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0017ffd8;
    pcVar3 = "Failure allocating sas key.";
    iVar1 = 0x29;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiexsas.c"
            ,"construct_httpex_sas",iVar1,1,pcVar3);
LAB_0017ffd8:
  HTTPAPIEX_SAS_Destroy(handle);
  return (HTTPAPIEX_SAS_STATE *)0x0;
}

Assistant:

static HTTPAPIEX_SAS_STATE* construct_httpex_sas(const char* key, const char* uriResource, const char* keyName)
{
    HTTPAPIEX_SAS_STATE* result;

    result = (HTTPAPIEX_SAS_STATE*)malloc(sizeof(HTTPAPIEX_SAS_STATE));
    if (result == NULL)
    {
        LogError("Failure allocating HTTPAPIEX_SAS_Create.");
    }
    else
    {
        (void)memset(result, 0, sizeof(HTTPAPIEX_SAS_STATE));
        if (mallocAndStrcpy_s(&result->key, key) != 0)
        {
            /*Codes_SRS_HTTPAPIEXSAS_06_004: [If there are any other errors in the instantiation of this handle then HTTPAPIEX_SAS_Create shall return NULL.]*/
            LogError("Failure allocating sas key.");
            HTTPAPIEX_SAS_Destroy(result);
            result = NULL;
        }
        else if (mallocAndStrcpy_s(&result->uriResource, uriResource) != 0)
        {
            /*Codes_SRS_HTTPAPIEXSAS_06_004: [If there are any other errors in the instantiation of this handle then HTTPAPIEX_SAS_Create shall return NULL.]*/
            LogError("Failure allocating sas uriResource.");
            HTTPAPIEX_SAS_Destroy(result);
            result = NULL;
        }
        else if (keyName != NULL && mallocAndStrcpy_s(&result->keyName, keyName) != 0)
        {
            /*Codes_SRS_HTTPAPIEXSAS_06_004: [If there are any other errors in the instantiation of this handle then HTTPAPIEX_SAS_Create shall return NULL.]*/
            LogError("Failure allocating sas keyName.");
            HTTPAPIEX_SAS_Destroy(result);
            result = NULL;
        }
    }
    return result;
}